

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::fn::
view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
::erase(view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
        *this,__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
              b,__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                e)

{
  bool bVar1;
  logic_error *this_00;
  __cxx11 local_f0 [48];
  string local_c0 [32];
  X local_a0 [8];
  X local_80 [8];
  X local_60 [8];
  X local_40 [8];
  view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *local_20;
  view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *this_local;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  e_local;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  b_local;
  
  local_20 = this;
  this_local = (view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
                *)e._M_current;
  e_local = b;
  bVar1 = __gnu_cxx::operator==(&e_local,&this->it_beg);
  if (bVar1) {
    (this->it_beg)._M_current = (X *)this_local;
  }
  else {
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
                        *)&this_local,&this->it_end);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string(local_c0);
      std::operator+(local_a0,(char *)local_c0);
      std::operator+(local_80,(char *)local_a0);
      std::__cxx11::to_string(local_f0,0x414);
      std::operator+(local_60,local_80);
      std::operator+(local_40,(char *)local_60);
      std::logic_error::logic_error(this_00,(string *)local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    impl::
    require_iterator_category_at_least<std::forward_iterator_tag,rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>>>
              (this);
    (this->it_end)._M_current = e_local._M_current;
  }
  return;
}

Assistant:

void erase(Iterator b, Iterator e)
        {
            // We support the erase method to obviate view-specific overloads 
            // for some hofs, e.g. take_while, take_first, drop_whille, drop_last, etc -
            // the container-specific overloads will work for views as well.

            if(b == it_beg) {
                // erase at front
                it_beg = e;
            } else if(e == it_end) {

                // erase at end
                impl::require_iterator_category_at_least<std::forward_iterator_tag>(*this);

                it_end = b;
            } else {
                RANGELESS_FN_THROW("Can only erase at the head or at the tail of the view");
            }
        }